

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCommandLineArguments.cxx
# Opt level: O2

int testCommandLineArguments(int argc,char **argv)

{
  double dVar1;
  char *__s2;
  __type _Var2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  double *pdVar6;
  undefined **ppuVar7;
  ulong uVar8;
  uint uVar9;
  int *piVar10;
  size_type __n;
  long lVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  reference rVar12;
  bool bool_arg1;
  bool some_bool_variable1;
  bool some_bool_variable;
  double local_1d0;
  allocator local_1c4;
  allocator local_1c3;
  allocator local_1c2;
  allocator local_1c1;
  int bool_arg2;
  int some_int_variable;
  vector<char_*,_std::allocator<char_*>_> strings_argument;
  char *some_string_variable;
  CommandLineArguments arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stl_strings_argument;
  vector<double,_std::allocator<double>_> doubles_argument;
  vector<int,_std::allocator<int>_> numbers_argument;
  vector<bool,_std::allocator<bool>_> bools_argument;
  double some_double_variable;
  string some_stl_string_variable;
  string valid_stl_strings [4];
  
  cmsys::CommandLineArguments::CommandLineArguments(&arg);
  cmsys::CommandLineArguments::Initialize(&arg,argc,argv);
  cmsys::CommandLineArguments::SetClientData(&arg,(void *)0x123);
  cmsys::CommandLineArguments::SetUnknownArgumentCallback(&arg,unknown_argument);
  some_int_variable = 10;
  some_double_variable = 10.1;
  some_string_variable = (char *)0x0;
  std::__cxx11::string::string
            ((string *)&some_stl_string_variable,"",(allocator *)valid_stl_strings);
  bool_arg2 = 0;
  numbers_argument.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  some_bool_variable = false;
  doubles_argument.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  some_bool_variable1 = false;
  bools_argument.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  bool_arg1 = false;
  bools_argument.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  bools_argument.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  numbers_argument.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  numbers_argument.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  bools_argument.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  doubles_argument.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  doubles_argument.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bools_argument.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  strings_argument.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  strings_argument.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  strings_argument.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  stl_strings_argument.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  stl_strings_argument.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  stl_strings_argument.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)valid_stl_strings,"ken",&local_1c1);
  std::__cxx11::string::string((string *)(valid_stl_strings + 1),"brad",&local_1c2);
  std::__cxx11::string::string((string *)(valid_stl_strings + 2),"bill",&local_1c3);
  std::__cxx11::string::string((string *)(valid_stl_strings + 3),"andy",&local_1c4);
  cmsys::CommandLineArguments::AddArgument
            (&arg,"--some-int-variable",SPACE_ARGUMENT,&some_int_variable,
             "Set some random int variable");
  cmsys::CommandLineArguments::AddArgument
            (&arg,"--some-double-variable",CONCAT_ARGUMENT,&some_double_variable,
             "Set some random double variable");
  cmsys::CommandLineArguments::AddArgument
            (&arg,"--some-string-variable",EQUAL_ARGUMENT,&some_string_variable,
             "Set some random string variable");
  cmsys::CommandLineArguments::AddArgument
            (&arg,"--some-stl-string-variable",EQUAL_ARGUMENT,&some_stl_string_variable,
             "Set some random stl string variable");
  cmsys::CommandLineArguments::AddArgument
            (&arg,"--some-bool-variable",EQUAL_ARGUMENT,&some_bool_variable,
             "Set some random bool variable");
  cmsys::CommandLineArguments::AddArgument
            (&arg,"--another-bool-variable",NO_ARGUMENT,&some_bool_variable1,
             "Set some random bool variable 1");
  cmsys::CommandLineArguments::AddBooleanArgument
            (&arg,"--set-bool-arg1",&bool_arg1,"Test AddBooleanArgument 1");
  cmsys::CommandLineArguments::AddBooleanArgument
            (&arg,"--set-bool-arg2",&bool_arg2,"Test AddBooleanArgument 2");
  cmsys::CommandLineArguments::AddArgument
            (&arg,"--some-multi-argument",MULTI_ARGUMENT,&numbers_argument,
             "Some multiple values variable");
  cmsys::CommandLineArguments::AddArgument
            (&arg,"-N",SPACE_ARGUMENT,&doubles_argument,"Some explicit multiple values variable");
  cmsys::CommandLineArguments::AddArgument
            (&arg,"-BB",CONCAT_ARGUMENT,&bools_argument,"Some explicit multiple values variable");
  cmsys::CommandLineArguments::AddArgument
            (&arg,"-SS",EQUAL_ARGUMENT,&strings_argument,"Some explicit multiple values variable");
  cmsys::CommandLineArguments::AddArgument
            (&arg,"-SSS",MULTI_ARGUMENT,&stl_strings_argument,
             "Some explicit multiple values variable");
  cmsys::CommandLineArguments::AddCallback
            (&arg,"-A",NO_ARGUMENT,argument,(void *)0x123,
             "Some option -A. This option has a multiline comment. It should demonstrate how the code splits lines."
            );
  cmsys::CommandLineArguments::AddCallback
            (&arg,"-B",SPACE_ARGUMENT,argument,(void *)0x123,"Option -B takes argument with space");
  cmsys::CommandLineArguments::AddCallback
            (&arg,"-C",EQUAL_ARGUMENT,argument,(void *)0x123,"Option -C takes argument after =");
  cmsys::CommandLineArguments::AddCallback
            (&arg,"-D",CONCAT_ARGUMENT,argument,(void *)0x123,
             "This option takes concatinated argument");
  cmsys::CommandLineArguments::AddCallback(&arg,"--long1",NO_ARGUMENT,argument,(void *)0x123,"-A");
  cmsys::CommandLineArguments::AddCallback
            (&arg,"--long2",SPACE_ARGUMENT,argument,(void *)0x123,"-B");
  cmsys::CommandLineArguments::AddCallback
            (&arg,"--long3",EQUAL_ARGUMENT,argument,(void *)0x123,"Same as -C but a bit different");
  local_1d0._0_4_ = 1;
  cmsys::CommandLineArguments::AddCallback
            (&arg,"--long4",CONCAT_ARGUMENT,argument,(void *)0x123,"-C");
  iVar3 = cmsys::CommandLineArguments::Parse(&arg);
  if (iVar3 == 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Problem parsing arguments");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  uVar9 = (uint)(iVar3 == 0);
  poVar4 = std::operator<<((ostream *)&std::cout,"Help: ");
  poVar4 = std::operator<<(poVar4,arg.Help._M_dataplus._M_p);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"Some int variable was set to: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,some_int_variable);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::operator<<((ostream *)&std::cout,"Some double variable was set to: ");
  poVar4 = std::ostream::_M_insert<double>(some_double_variable);
  std::endl<char,std::char_traits<char>>(poVar4);
  if (some_string_variable != (char *)0x0) {
    iVar3 = strcmp(some_string_variable,"test string with space");
    if (iVar3 == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Some string variable was set to: ");
      poVar4 = std::operator<<(poVar4,some_string_variable);
      std::endl<char,std::char_traits<char>>(poVar4);
      if (some_string_variable != (char *)0x0) {
        operator_delete__(some_string_variable);
      }
      goto LAB_0012204b;
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"Problem setting string variable");
  std::endl<char,std::char_traits<char>>(poVar4);
  uVar9 = 1;
LAB_0012204b:
  if ((long)numbers_argument.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)numbers_argument.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == 0x28) {
    std::operator<<((ostream *)&std::cout,"numbers_argument argument set:");
    piVar10 = &DAT_00139fa0;
    for (lVar5 = 0; lVar5 != 10; lVar5 = lVar5 + 1) {
      poVar4 = std::operator<<((ostream *)&std::cout," ");
      std::ostream::operator<<
                (poVar4,numbers_argument.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar5]);
      iVar3 = *piVar10;
      if (numbers_argument.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar5] != iVar3) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Problem setting numbers_argument. Value of "
                                );
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4," is: [");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,numbers_argument.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar5]);
        poVar4 = std::operator<<(poVar4,"] <> [");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
        poVar4 = std::operator<<(poVar4,"]");
        std::endl<char,std::char_traits<char>>(poVar4);
        uVar9 = 1;
        break;
      }
      piVar10 = piVar10 + 1;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    local_1d0._0_4_ = uVar9;
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Problem setting numbers_argument. Size is: ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," should be: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,10);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  if ((long)doubles_argument.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)doubles_argument.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start == 0x18) {
    std::operator<<((ostream *)&std::cout,"doubles_argument argument set:");
    pdVar6 = (double *)&DAT_00139fd0;
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      std::operator<<((ostream *)&std::cout," ");
      std::ostream::_M_insert<double>
                (doubles_argument.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar5]);
      dVar1 = *pdVar6;
      if ((doubles_argument.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar5] != dVar1) ||
         (NAN(doubles_argument.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar5]) || NAN(dVar1))) {
        local_1d0 = dVar1;
        poVar4 = std::operator<<((ostream *)&std::cerr,"Problem setting doubles_argument. Value of "
                                );
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::operator<<(poVar4," is: [");
        poVar4 = std::ostream::_M_insert<double>
                           (doubles_argument.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar5]);
        std::operator<<(poVar4,"] <> [");
        poVar4 = std::ostream::_M_insert<double>(local_1d0);
        poVar4 = std::operator<<(poVar4,"]");
        std::endl<char,std::char_traits<char>>(poVar4);
        local_1d0._0_4_ = 1;
        break;
      }
      pdVar6 = pdVar6 + 1;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Problem setting doubles_argument. Size is: ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," should be: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::endl<char,std::char_traits<char>>(poVar4);
    local_1d0._0_4_ = 1;
  }
  if ((ulong)bools_argument.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
      ((long)bools_argument.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
      (long)bools_argument.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 == 3) {
    std::operator<<((ostream *)&std::cout,"bools_argument argument set:");
    for (__n = 0; __n != 3; __n = __n + 1) {
      poVar4 = std::operator<<((ostream *)&std::cout," ");
      std::vector<bool,_std::allocator<bool>_>::operator[](&bools_argument,__n);
      std::ostream::_M_insert<bool>(SUB81(poVar4,0));
      rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](&bools_argument,__n);
      if (((*rVar12._M_p & rVar12._M_mask) == 0) == (bool)(&DAT_00139876)[__n]) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Problem setting bools_argument. Value of ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4," is: [");
        std::vector<bool,_std::allocator<bool>_>::operator[](&bools_argument,__n);
        poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
        poVar4 = std::operator<<(poVar4,"] <> [");
        poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
        poVar4 = std::operator<<(poVar4,"]");
        std::endl<char,std::char_traits<char>>(poVar4);
        local_1d0._0_4_ = 1;
        break;
      }
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Problem setting bools_argument. Size is: ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," should be: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,3);
    std::endl<char,std::char_traits<char>>(poVar4);
    local_1d0._0_4_ = 1;
  }
  if ((long)strings_argument.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)strings_argument.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_start == 0x20) {
    std::operator<<((ostream *)&std::cout,"strings_argument argument set:");
    ppuVar7 = &PTR_anon_var_dwarf_21540_00149cd0;
    for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
      poVar4 = std::operator<<((ostream *)&std::cout," ");
      std::operator<<(poVar4,strings_argument.super__Vector_base<char_*,_std::allocator<char_*>_>.
                             _M_impl.super__Vector_impl_data._M_start[lVar5]);
      __s2 = *ppuVar7;
      iVar3 = strcmp(strings_argument.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar5],__s2);
      if (iVar3 != 0) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Problem setting strings_argument. Value of "
                                );
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4," is: [");
        poVar4 = std::operator<<(poVar4,strings_argument.
                                        super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                                        super__Vector_impl_data._M_start[lVar5]);
        poVar4 = std::operator<<(poVar4,"] <> [");
        poVar4 = std::operator<<(poVar4,__s2);
        poVar4 = std::operator<<(poVar4,"]");
        std::endl<char,std::char_traits<char>>(poVar4);
        local_1d0._0_4_ = 1;
        break;
      }
      ppuVar7 = ppuVar7 + 1;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Problem setting strings_argument. Size is: ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," should be: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,4);
    std::endl<char,std::char_traits<char>>(poVar4);
    local_1d0._0_4_ = 1;
  }
  if ((long)stl_strings_argument.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)stl_strings_argument.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x80) {
    std::operator<<((ostream *)&std::cout,"stl_strings_argument argument set:");
    lVar11 = 0;
    for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
      poVar4 = std::operator<<((ostream *)&std::cout," ");
      std::operator<<(poVar4,(string *)
                             ((long)&((stl_strings_argument.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + lVar11));
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&valid_stl_strings[0]._M_dataplus._M_p + lVar11);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&((stl_strings_argument.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar11),__rhs);
      if (!_Var2) {
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 "Problem setting stl_strings_argument. Value of ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4," is: [");
        poVar4 = std::operator<<(poVar4,(string *)
                                        ((long)&((stl_strings_argument.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                _M_dataplus)._M_p + lVar11));
        poVar4 = std::operator<<(poVar4,"] <> [");
        poVar4 = std::operator<<(poVar4,(string *)__rhs);
        poVar4 = std::operator<<(poVar4,"]");
        std::endl<char,std::char_traits<char>>(poVar4);
        local_1d0._0_4_ = 1;
        break;
      }
      lVar11 = lVar11 + 0x20;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Problem setting stl_strings_argument. Size is: "
                            );
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," should be: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,4);
    std::endl<char,std::char_traits<char>>(poVar4);
    local_1d0._0_4_ = 1;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Some STL String variable was set to: ");
  poVar4 = std::operator<<(poVar4,(string *)&some_stl_string_variable);
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"Some bool variable was set to: ");
  poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"Some bool variable was set to: ");
  poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"bool_arg1 variable was set to: ");
  poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"bool_arg2 variable was set to: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,bool_arg2);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  for (uVar8 = 0;
      uVar8 < (ulong)((long)strings_argument.super__Vector_base<char_*,_std::allocator<char_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)strings_argument.super__Vector_base<char_*,_std::allocator<char_*>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3); uVar8 = uVar8 + 1) {
    if (strings_argument.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar8] != (char *)0x0) {
      operator_delete__(strings_argument.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl
                        .super__Vector_impl_data._M_start[uVar8]);
    }
    strings_argument.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
    super__Vector_impl_data._M_start[uVar8] = (char *)0x0;
  }
  lVar5 = 0x60;
  do {
    std::__cxx11::string::~string((string *)((long)&valid_stl_strings[0]._M_dataplus._M_p + lVar5));
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&stl_strings_argument);
  std::_Vector_base<char_*,_std::allocator<char_*>_>::~_Vector_base
            (&strings_argument.super__Vector_base<char_*,_std::allocator<char_*>_>);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&bools_argument.super__Bvector_base<std::allocator<bool>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&doubles_argument.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&numbers_argument.super__Vector_base<int,_std::allocator<int>_>);
  std::__cxx11::string::~string((string *)&some_stl_string_variable);
  cmsys::CommandLineArguments::~CommandLineArguments(&arg);
  return local_1d0._0_4_;
}

Assistant:

int testCommandLineArguments(int argc, char* argv[])
{
  // Example run: ./testCommandLineArguments --some-int-variable 4
  // --another-bool-variable --some-bool-variable=yes
  // --some-stl-string-variable=foobar --set-bool-arg1 --set-bool-arg2
  // --some-string-variable=hello

  int res = 0;
  kwsys::CommandLineArguments arg;
  arg.Initialize(argc, argv);

  // For error handling
  arg.SetClientData(random_ptr);
  arg.SetUnknownArgumentCallback(unknown_argument);

  int some_int_variable = 10;
  double some_double_variable = 10.10;
  char* some_string_variable = 0;
  std::string some_stl_string_variable = "";
  bool some_bool_variable = false;
  bool some_bool_variable1 = false;
  bool bool_arg1 = false;
  int bool_arg2 = 0;

  std::vector<int> numbers_argument;
  int valid_numbers[] = { 5, 1, 8, 3, 7, 1, 3, 9, 7, 1 };

  std::vector<double> doubles_argument;
  double valid_doubles[] = { 12.5, 1.31, 22 };

  std::vector<bool> bools_argument;
  bool valid_bools[] = { true, true, false };

  std::vector<char*> strings_argument;
  const char* valid_strings[] = { "andy", "bill", "brad", "ken" };

  std::vector<std::string> stl_strings_argument;
  std::string valid_stl_strings[] = { "ken", "brad", "bill", "andy" };

  typedef kwsys::CommandLineArguments argT;

  arg.AddArgument("--some-int-variable", argT::SPACE_ARGUMENT,
                  &some_int_variable, "Set some random int variable");
  arg.AddArgument("--some-double-variable", argT::CONCAT_ARGUMENT,
                  &some_double_variable, "Set some random double variable");
  arg.AddArgument("--some-string-variable", argT::EQUAL_ARGUMENT,
                  &some_string_variable, "Set some random string variable");
  arg.AddArgument("--some-stl-string-variable", argT::EQUAL_ARGUMENT,
                  &some_stl_string_variable,
                  "Set some random stl string variable");
  arg.AddArgument("--some-bool-variable", argT::EQUAL_ARGUMENT,
                  &some_bool_variable, "Set some random bool variable");
  arg.AddArgument("--another-bool-variable", argT::NO_ARGUMENT,
                  &some_bool_variable1, "Set some random bool variable 1");
  arg.AddBooleanArgument("--set-bool-arg1", &bool_arg1,
                         "Test AddBooleanArgument 1");
  arg.AddBooleanArgument("--set-bool-arg2", &bool_arg2,
                         "Test AddBooleanArgument 2");
  arg.AddArgument("--some-multi-argument", argT::MULTI_ARGUMENT,
                  &numbers_argument, "Some multiple values variable");
  arg.AddArgument("-N", argT::SPACE_ARGUMENT, &doubles_argument,
                  "Some explicit multiple values variable");
  arg.AddArgument("-BB", argT::CONCAT_ARGUMENT, &bools_argument,
                  "Some explicit multiple values variable");
  arg.AddArgument("-SS", argT::EQUAL_ARGUMENT, &strings_argument,
                  "Some explicit multiple values variable");
  arg.AddArgument("-SSS", argT::MULTI_ARGUMENT, &stl_strings_argument,
                  "Some explicit multiple values variable");

  arg.AddCallback("-A", argT::NO_ARGUMENT, argument, random_ptr,
                  "Some option -A. This option has a multiline comment. It "
                  "should demonstrate how the code splits lines.");
  arg.AddCallback("-B", argT::SPACE_ARGUMENT, argument, random_ptr,
                  "Option -B takes argument with space");
  arg.AddCallback("-C", argT::EQUAL_ARGUMENT, argument, random_ptr,
                  "Option -C takes argument after =");
  arg.AddCallback("-D", argT::CONCAT_ARGUMENT, argument, random_ptr,
                  "This option takes concatinated argument");
  arg.AddCallback("--long1", argT::NO_ARGUMENT, argument, random_ptr, "-A");
  arg.AddCallback("--long2", argT::SPACE_ARGUMENT, argument, random_ptr, "-B");
  arg.AddCallback("--long3", argT::EQUAL_ARGUMENT, argument, random_ptr,
                  "Same as -C but a bit different");
  arg.AddCallback("--long4", argT::CONCAT_ARGUMENT, argument, random_ptr,
                  "-C");

  if (!arg.Parse()) {
    std::cerr << "Problem parsing arguments" << std::endl;
    res = 1;
  }
  std::cout << "Help: " << arg.GetHelp() << std::endl;

  std::cout << "Some int variable was set to: " << some_int_variable
            << std::endl;
  std::cout << "Some double variable was set to: " << some_double_variable
            << std::endl;
  if (some_string_variable &&
      strcmp(some_string_variable, "test string with space") == 0) {
    std::cout << "Some string variable was set to: " << some_string_variable
              << std::endl;
    delete[] some_string_variable;
  } else {
    std::cerr << "Problem setting string variable" << std::endl;
    res = 1;
  }
  size_t cc;
#define CompareTwoLists(list1, list_valid, lsize)                             \
  if (list1.size() != lsize) {                                                \
    std::cerr << "Problem setting " #list1 ". Size is: " << list1.size()      \
              << " should be: " << lsize << std::endl;                        \
    res = 1;                                                                  \
  } else {                                                                    \
    std::cout << #list1 " argument set:";                                     \
    for (cc = 0; cc < lsize; ++cc) {                                          \
      std::cout << " " << list1[cc];                                          \
      if (!CompareTwoItemsOnList(list1[cc], list_valid[cc])) {                \
        std::cerr << "Problem setting " #list1 ". Value of " << cc            \
                  << " is: [" << list1[cc] << "] <> [" << list_valid[cc]      \
                  << "]" << std::endl;                                        \
        res = 1;                                                              \
        break;                                                                \
      }                                                                       \
    }                                                                         \
    std::cout << std::endl;                                                   \
  }

  CompareTwoLists(numbers_argument, valid_numbers, 10);
  CompareTwoLists(doubles_argument, valid_doubles, 3);
  CompareTwoLists(bools_argument, valid_bools, 3);
  CompareTwoLists(strings_argument, valid_strings, 4);
  CompareTwoLists(stl_strings_argument, valid_stl_strings, 4);

  std::cout << "Some STL String variable was set to: "
            << some_stl_string_variable << std::endl;
  std::cout << "Some bool variable was set to: " << some_bool_variable
            << std::endl;
  std::cout << "Some bool variable was set to: " << some_bool_variable1
            << std::endl;
  std::cout << "bool_arg1 variable was set to: " << bool_arg1 << std::endl;
  std::cout << "bool_arg2 variable was set to: " << bool_arg2 << std::endl;
  std::cout << std::endl;

  for (cc = 0; cc < strings_argument.size(); ++cc) {
    delete[] strings_argument[cc];
    strings_argument[cc] = 0;
  }
  return res;
}